

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::NavigationBar::NavigationBar(NavigationBar *this,QWidget *parent)

{
  NavigationBarPrivate *this_00;
  NavigationBarPrivate *this_01;
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  NavigationBar *this_local;
  
  local_18 = parent;
  parent_local = &this->super_QWidget;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_00240c10;
  *(undefined ***)&this->field_0x10 = &PTR__NavigationBar_00240dc0;
  this_00 = (NavigationBarPrivate *)operator_new(0x80);
  NavigationBarPrivate::NavigationBarPrivate(this_00,this);
  QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
  ::QScopedPointer(&this->d,this_00);
  this_01 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
            ::operator->(&this->d);
  NavigationBarPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

NavigationBar::NavigationBar( QWidget * parent )
	:	QWidget( parent )
	,	d( new NavigationBarPrivate( this ) )
{
	d->init();
}